

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_tag.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::UnionTagBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  string_t sVar1;
  bool bVar2;
  LogicalTypeId LVar3;
  pointer pEVar4;
  ParameterNotResolvedException *this;
  BinderException *pBVar5;
  size_type sVar6;
  InternalException *this_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  anon_struct_16_3_d7536bce_for_pointer aVar7;
  LogicalType enum_type;
  string_t str;
  idx_t i;
  Vector varchar_vector;
  idx_t member_count;
  string_t *in_stack_fffffffffffffda8;
  LogicalType *in_stack_fffffffffffffdb0;
  Vector *other;
  LogicalType *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  Vector local_1b0 [24];
  undefined8 local_198;
  char *pcStack_190;
  anon_struct_16_3_d7536bce_for_pointer local_180;
  undefined8 local_170;
  char *pcStack_168;
  ulong local_160;
  LogicalType local_158 [24];
  Vector local_140 [110];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  ulong local_b0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  
  local_20 = in_RCX;
  bVar2 = std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  if (bVar2) {
    local_55 = 1;
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"Missing required arguments for union_tag function.",&local_41);
    duckdb::BinderException::BinderException(pBVar5,local_40);
    local_55 = 0;
    __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffdb0);
  LVar3 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  if (LVar3 == UNKNOWN) {
    this = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this);
    __cxa_throw(this,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffdb0);
  LVar3 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  if (LVar3 != UNION) {
    local_7a = 1;
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"First argument to union_tag function must be a union type.",&local_79);
    duckdb::BinderException::BinderException(pBVar5,local_78);
    local_7a = 0;
    __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  sVar6 = std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::size(local_20);
  if (1 < sVar6) {
    local_a2 = 1;
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,"Too many arguments, union_tag takes at most one argument.",&local_a1);
    duckdb::BinderException::BinderException(pBVar5,local_a0);
    local_a2 = 0;
    __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffdb0);
  local_b0 = duckdb::UnionType::GetMemberCount((LogicalType *)(pEVar4 + 0x38));
  if (local_b0 == 0) {
    local_d2 = 1;
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Can\'t get tags from an empty union",&local_d1);
    duckdb::InternalException::InternalException(this_00,local_d0);
    local_d2 = 0;
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffdb0);
  vector<duckdb::LogicalType,_true>::operator[]
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffdb0,
             (size_type)in_stack_fffffffffffffda8);
  LogicalType::operator=(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  duckdb::LogicalType::LogicalType(local_158,VARCHAR);
  duckdb::Vector::Vector(local_140,local_158,local_b0);
  duckdb::LogicalType::~LogicalType(local_158);
  aVar7.ptr = (char *)in_stack_fffffffffffffdb0;
  aVar7._0_8_ = in_stack_fffffffffffffdb8;
  for (local_160 = 0; local_160 < local_b0; local_160 = local_160 + 1) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)aVar7.ptr,(size_type)in_stack_fffffffffffffda8);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)aVar7.ptr);
    duckdb::UnionType::GetMemberName_abi_cxx11_((LogicalType *)(pEVar4 + 0x38),local_160);
    string_t::string_t((string_t *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                       aVar7._0_8_);
    in_stack_fffffffffffffdc7 = string_t::IsInlined((string_t *)0xf27026);
    if ((bool)in_stack_fffffffffffffdc7) {
      local_180.ptr = pcStack_168;
      local_180.length = (undefined4)local_170;
      local_180.prefix[0] = local_170._4_1_;
      local_180.prefix[1] = local_170._5_1_;
      local_180.prefix[2] = local_170._6_1_;
      local_180.prefix[3] = local_170._7_1_;
    }
    else {
      local_198 = local_170;
      pcStack_190 = pcStack_168;
      sVar1.value.pointer.ptr = pcStack_168;
      sVar1.value._0_8_ = local_170;
      aVar7 = (anon_struct_16_3_d7536bce_for_pointer)
              duckdb::StringVector::AddString(local_140,sVar1);
      local_180 = aVar7;
    }
    in_stack_fffffffffffffda8 = FlatVector::GetData<duckdb::string_t>((Vector *)0xf270b8);
    in_stack_fffffffffffffda8[local_160].value.pointer = local_180;
  }
  duckdb::LogicalType::ENUM(local_1b0,(ulong)local_140);
  other = (Vector *)aVar7.ptr;
  LogicalType::operator=(aVar7._0_8_,(LogicalType *)other);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             other,in_stack_fffffffffffffda8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_1b0);
  Vector::~Vector(other);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> UnionTagBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {

	if (arguments.empty()) {
		throw BinderException("Missing required arguments for union_tag function.");
	}

	if (LogicalTypeId::UNKNOWN == arguments[0]->return_type.id()) {
		throw ParameterNotResolvedException();
	}

	if (LogicalTypeId::UNION != arguments[0]->return_type.id()) {
		throw BinderException("First argument to union_tag function must be a union type.");
	}

	if (arguments.size() > 1) {
		throw BinderException("Too many arguments, union_tag takes at most one argument.");
	}

	auto member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (member_count == 0) {
		// this should never happen, empty unions are not allowed
		throw InternalException("Can't get tags from an empty union");
	}

	bound_function.arguments[0] = arguments[0]->return_type;

	auto varchar_vector = Vector(LogicalType::VARCHAR, member_count);
	for (idx_t i = 0; i < member_count; i++) {
		auto str = string_t(UnionType::GetMemberName(arguments[0]->return_type, i));
		FlatVector::GetData<string_t>(varchar_vector)[i] =
		    str.IsInlined() ? str : StringVector::AddString(varchar_vector, str);
	}
	auto enum_type = LogicalType::ENUM(varchar_vector, member_count);
	bound_function.return_type = enum_type;

	return nullptr;
}